

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void default_skip_mask(mode_skip_mask_t *mask,REF_SET ref_set)

{
  MV_REFERENCE_FRAME ref1;
  long lVar1;
  MV_REFERENCE_FRAME (*paMVar2) [2];
  int i;
  _Bool (*pa_Var3) [9];
  long lVar4;
  
  if (ref_set == REF_SET_FULL) {
    *(undefined8 *)(mask->ref_combo[5] + 3) = 0;
    *(undefined8 *)(mask->ref_combo[6] + 2) = 0;
    *(undefined8 *)(mask->ref_combo[3] + 5) = 0;
    *(undefined8 *)(mask->ref_combo[4] + 4) = 0;
    *(undefined8 *)(mask->ref_combo[1] + 7) = 0;
    *(undefined8 *)(mask->ref_combo[2] + 6) = 0;
    *(_Bool *)((long)(mask->ref_combo + 0) + 0) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 1) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 2) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 3) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 4) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 5) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 6) = false;
    *(_Bool *)((long)(mask->ref_combo + 0) + 7) = false;
    *(undefined8 *)(mask->ref_combo[0] + 8) = 0;
    mask->pred_modes[4] = 0;
    mask->pred_modes[5] = 0;
    mask->pred_modes[6] = 0;
    mask->pred_modes[7] = 0;
    mask->pred_modes[0] = 0;
    mask->pred_modes[1] = 0;
    mask->pred_modes[2] = 0;
    mask->pred_modes[3] = 0;
    pa_Var3 = mask->ref_combo;
    *(_Bool *)((long)(pa_Var3 + 7) + 1) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 2) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 3) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 4) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 5) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 6) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 7) = false;
    *(_Bool *)((long)(pa_Var3 + 7) + 8) = false;
    return;
  }
  mask->pred_modes[4] = 0;
  mask->pred_modes[5] = 0;
  mask->pred_modes[6] = 0;
  mask->pred_modes[7] = 0;
  mask->pred_modes[0] = 0;
  mask->pred_modes[1] = 0;
  mask->pred_modes[2] = 0;
  mask->pred_modes[3] = 0;
  pa_Var3 = mask->ref_combo;
  for (lVar1 = 0; lVar4 = -9, lVar1 != 8; lVar1 = lVar1 + 1) {
    for (; lVar4 != 0; lVar4 = lVar4 + 1) {
      pa_Var3[1][lVar4] = true;
    }
    pa_Var3 = pa_Var3 + 1;
  }
  paMVar2 = real_time_ref_combos;
  if (ref_set == REF_SET_REDUCED) {
    paMVar2 = reduced_ref_combos;
  }
  lVar1 = 4;
  if (ref_set == REF_SET_REDUCED) {
    lVar1 = 0x10;
  }
  for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
    mask->ref_combo[paMVar2[lVar4][0]][(long)paMVar2[lVar4][1] + 1] = false;
  }
  return;
}

Assistant:

static inline void default_skip_mask(mode_skip_mask_t *mask, REF_SET ref_set) {
  if (ref_set == REF_SET_FULL) {
    // Everything available by default.
    memset(mask, 0, sizeof(*mask));
  } else {
    // All modes available by default.
    memset(mask->pred_modes, 0, sizeof(mask->pred_modes));
    // All references disabled first.
    for (MV_REFERENCE_FRAME ref1 = INTRA_FRAME; ref1 < REF_FRAMES; ++ref1) {
      for (MV_REFERENCE_FRAME ref2 = NONE_FRAME; ref2 < REF_FRAMES; ++ref2) {
        mask->ref_combo[ref1][ref2 + 1] = true;
      }
    }
    const MV_REFERENCE_FRAME(*ref_set_combos)[2];
    int num_ref_combos;

    // Then enable reduced set of references explicitly.
    switch (ref_set) {
      case REF_SET_REDUCED:
        ref_set_combos = reduced_ref_combos;
        num_ref_combos =
            (int)sizeof(reduced_ref_combos) / sizeof(reduced_ref_combos[0]);
        break;
      case REF_SET_REALTIME:
        ref_set_combos = real_time_ref_combos;
        num_ref_combos =
            (int)sizeof(real_time_ref_combos) / sizeof(real_time_ref_combos[0]);
        break;
      default: assert(0); num_ref_combos = 0;
    }

    for (int i = 0; i < num_ref_combos; ++i) {
      const MV_REFERENCE_FRAME *const this_combo = ref_set_combos[i];
      mask->ref_combo[this_combo[0]][this_combo[1] + 1] = false;
    }
  }
}